

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O3

void GD::save_load_regressor<dense_parameters>
               (vw *all,io_buf *model_file,bool read,bool text,dense_parameters *weights)

{
  float fVar1;
  weight *pwVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  size_t sVar5;
  size_t sVar6;
  weight *pwVar7;
  vw_exception *this;
  byte bVar8;
  uint uVar9;
  uint64_t uVar10;
  ulong uVar11;
  float *data;
  long lVar12;
  ulong *data_00;
  uint32_t old_i;
  uint64_t i;
  stringstream msg;
  undefined1 local_1f4 [4];
  ulong local_1f0;
  vw *local_1e8;
  long local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  if (all->print_invert == true) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    p_Var4 = (all->name_index_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1e8 = (vw *)&(all->name_index_map)._M_t._M_impl.super__Rb_tree_header;
    if ((vw *)p_Var4 != local_1e8) {
      do {
        uVar11 = *(long *)(p_Var4 + 2) << ((byte)weights->_stride_shift & 0x3f) &
                 weights->_weight_mask;
        pwVar2 = weights->_begin;
        fVar1 = pwVar2[uVar11];
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
          bin_text_write_fixed(model_file,*(char **)(p_Var4 + 1),1,(stringstream *)local_1b8,true);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
          data = pwVar2 + uVar11;
          poVar3 = std::ostream::_M_insert<double>((double)*data);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          bin_text_write_fixed(model_file,(char *)data,4,(stringstream *)local_1b8,true);
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((vw *)p_Var4 != local_1e8);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  else {
    local_1f0 = 0;
    local_1f4 = (undefined1  [4])0x0;
    uVar9 = all->num_bits;
    bVar8 = (byte)uVar9;
    local_1e8 = all;
    if (read) {
      while( true ) {
        if (uVar9 < 0x1f) {
          sVar5 = io_buf::bin_read_fixed(model_file,local_1f4,4,"");
          local_1f0 = (ulong)(uint)local_1f4;
        }
        else {
          sVar5 = io_buf::bin_read_fixed(model_file,(char *)&local_1f0,8,"");
        }
        if (sVar5 == 0) break;
        if ((ulong)(1L << (bVar8 & 0x3f)) <= local_1f0) {
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Model content is corrupted, weight vector index ",0x30);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3," must be less than total vector length ",0x27);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          this = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (this,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/gd.cc"
                     ,0x2da,&local_1d8);
          __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        sVar6 = io_buf::bin_read_fixed
                          (model_file,
                           (char *)(weights->_begin +
                                   (local_1f0 << ((byte)weights->_stride_shift & 0x3f) &
                                   weights->_weight_mask)),4,"");
        if (sVar5 + sVar6 == 0) {
          return;
        }
        uVar9 = local_1e8->num_bits;
      }
    }
    else {
      pwVar2 = weights->_begin;
      uVar10 = weights->_weight_mask;
      if (pwVar2 != pwVar2 + uVar10 + 1) {
        local_1e0 = (1L << ((byte)weights->_stride_shift & 0x3f)) << 2;
        lVar12 = 0;
        pwVar7 = pwVar2;
        do {
          if ((*(float *)((long)pwVar2 + lVar12) != 0.0) || (NAN(*(float *)((long)pwVar2 + lVar12)))
             ) {
            local_1f0 = (ulong)(lVar12 >> 2) >> ((byte)weights->_stride_shift & 0x3f);
            std::__cxx11::stringstream::stringstream(local_1b8);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            sVar5 = 8;
            data_00 = &local_1f0;
            if (local_1e8->num_bits < 0x1f) {
              local_1f4 = (undefined1  [4])(uint)local_1f0;
              sVar5 = 4;
              data_00 = (ulong *)local_1f4;
            }
            bin_text_write_fixed(model_file,(char *)data_00,sVar5,(stringstream *)local_1b8,text);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            poVar3 = std::ostream::_M_insert<double>((double)*(float *)((long)pwVar2 + lVar12));
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
            bin_text_write_fixed
                      (model_file,(char *)((long)pwVar2 + lVar12),4,(stringstream *)local_1b8,text);
            std::__cxx11::stringstream::~stringstream(local_1b8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            pwVar7 = weights->_begin;
            uVar10 = weights->_weight_mask;
          }
          lVar12 = lVar12 + local_1e0;
        } while ((weight *)((long)pwVar2 + lVar12) != pwVar7 + uVar10 + 1);
      }
    }
  }
  return;
}

Assistant:

void save_load_regressor(vw& all, io_buf& model_file, bool read, bool text, T& weights)
{
  size_t brw = 1;

  if (all.print_invert)  // write readable model with feature names
  {
    stringstream msg;
    typedef std::map<std::string, size_t> str_int_map;

    for (str_int_map::iterator it = all.name_index_map.begin(); it != all.name_index_map.end(); ++it)
    {
      weight* v = &weights.strided_index(it->second);
      if (*v != 0.)
      {
        msg << it->first;
        brw = bin_text_write_fixed(model_file, (char*)it->first.c_str(), sizeof(*it->first.c_str()), msg, true);

        msg << ":" << it->second << ":" << *v << "\n";
        bin_text_write_fixed(model_file, (char*)&(*v), sizeof(*v), msg, true);
      }
    }
    return;
  }

  uint64_t i = 0;
  uint32_t old_i = 0;
  uint64_t length = (uint64_t)1 << all.num_bits;
  if (read)
    do
    {
      brw = 1;
      if (all.num_bits < 31)  // backwards compatible
      {
        brw = model_file.bin_read_fixed((char*)&old_i, sizeof(old_i), "");
        i = old_i;
      }
      else
        brw = model_file.bin_read_fixed((char*)&i, sizeof(i), "");
      if (brw > 0)
      {
        if (i >= length)
          THROW("Model content is corrupted, weight vector index " << i << " must be less than total vector length "
                                                                   << length);
        weight* v = &weights.strided_index(i);
        brw += model_file.bin_read_fixed((char*)&(*v), sizeof(*v), "");
      }
    } while (brw > 0);
  else  // write
    for (typename T::iterator v = weights.begin(); v != weights.end(); ++v)
      if (*v != 0.)
      {
        i = v.index() >> weights.stride_shift();
        stringstream msg;
        msg << i;

        if (all.num_bits < 31)
        {
          old_i = (uint32_t)i;
          brw = bin_text_write_fixed(model_file, (char*)&old_i, sizeof(old_i), msg, text);
        }
        else
          brw = bin_text_write_fixed(model_file, (char*)&i, sizeof(i), msg, text);

        msg << ":" << *v << "\n";
        brw += bin_text_write_fixed(model_file, (char*)&(*v), sizeof(*v), msg, text);
      }
}